

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_blocked_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_blocked_sse41_128_16
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  __m128i *ptr;
  int iVar18;
  __m128i *ptr_00;
  __m128i *ptr_01;
  parasail_result_t *ppVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  __m128i *palVar31;
  long lVar32;
  long lVar33;
  undefined2 uVar34;
  size_t size;
  __m128i extraout_XMM0;
  __m128i alVar35;
  undefined1 auVar36 [16];
  short sVar37;
  short sVar39;
  undefined1 in_XMM2 [16];
  undefined1 auVar38 [16];
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  ushort uVar50;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  undefined1 auVar51 [16];
  ushort uVar58;
  ushort uVar59;
  short sVar60;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  undefined1 auVar61 [16];
  short sVar75;
  undefined1 auVar62 [16];
  short sVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  short sVar79;
  undefined1 auVar80 [16];
  __m128i_16_t t;
  longlong local_88;
  longlong lStack_80;
  char *local_70;
  parasail_result_t *local_68;
  __m128i *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar21 = s1Len + 0xe;
  if (-1 < (int)(s1Len + 7U)) {
    uVar21 = s1Len + 7U;
  }
  uVar26 = (int)uVar21 >> 3;
  local_70 = s2;
  ptr_00 = parasail_memalign___m128i(0x10,(long)(int)((uVar21 & 0xfffffff8) * 3));
  size = (size_t)(int)uVar26;
  local_60 = parasail_memalign___m128i(0x10,size);
  ptr_01 = parasail_memalign___m128i(0x10,size);
  local_48 = ZEXT416((uint)open);
  local_58 = ZEXT416((uint)gap);
  ppVar19 = parasail_result_new_table1(uVar21 & 0xfffffff8,s2Len);
  ptr = local_60;
  uVar21 = 1;
  if (1 < (int)uVar26) {
    uVar21 = uVar26;
  }
  iVar24 = 0;
  lVar28 = 0;
  alVar35 = extraout_XMM0;
  do {
    if (0 < s1Len) {
      lVar28 = (long)(int)lVar28;
      lVar29 = 0;
      uVar30 = 0;
      do {
        lVar32 = 0;
        lVar33 = lVar29;
        do {
          if (lVar33 < s1Len) {
            uVar34 = (undefined2)
                     matrix->matrix[(long)matrix->mapper[(byte)s1[lVar33]] * (long)matrix->size];
          }
          else {
            uVar34 = 0;
          }
          *(undefined2 *)((long)&local_88 + lVar32) = uVar34;
          lVar33 = lVar33 + 1;
          lVar32 = lVar32 + 2;
        } while (lVar32 != 0x10);
        alVar35[1] = lStack_80;
        alVar35[0] = local_88;
        ptr_00[lVar28] = alVar35;
        lVar28 = lVar28 + 1;
        uVar30 = uVar30 + 1;
        lVar29 = lVar29 + 8;
      } while (uVar30 != uVar21);
    }
    iVar24 = iVar24 + 1;
  } while (iVar24 != 0x18);
  if (0 < s1Len) {
    uVar20 = 1;
    if (1 < (int)uVar26) {
      uVar20 = (ulong)uVar26;
    }
    uVar23 = 0;
    alVar35[0] = 0;
    alVar35[1] = 0;
    do {
      lVar28 = 0;
      do {
        *(short *)((long)&local_88 + lVar28 * 2) = -(short)open;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 8);
      local_60[uVar23] = (__m128i)0x0;
      ptr_01[uVar23][0] = local_88;
      ptr_01[uVar23][1] = lStack_80;
      uVar23 = uVar23 + 1;
    } while (uVar23 != uVar20);
  }
  if (s2Len < 1) {
    auVar36 = (undefined1  [16])0x0;
  }
  else {
    auVar36 = pshuflw((undefined1  [16])alVar35,local_48,0);
    auVar38 = pshuflw(in_XMM2,local_58,0);
    sVar37 = auVar38._0_2_;
    sVar40 = auVar36._0_2_;
    sVar39 = auVar38._2_2_;
    sVar41 = auVar36._2_2_;
    uVar20 = (ulong)(uint)s2Len;
    uVar23 = 1;
    if (1 < (int)uVar26) {
      uVar23 = (ulong)uVar26;
    }
    uVar25 = 0;
    auVar36 = (undefined1  [16])0x0;
    do {
      if (0 < s1Len) {
        iVar24 = matrix->mapper[(byte)local_70[uVar25]];
        auVar51 = (undefined1  [16])0x0;
        uVar27 = 0;
        auVar38 = auVar36;
        uVar59 = 0xc000;
        do {
          alVar35 = local_60[uVar27];
          palVar31 = ptr_01 + uVar27;
          sVar42 = (short)(*palVar31)[0];
          sVar43 = *(short *)((long)*palVar31 + 2);
          sVar44 = *(short *)((long)*palVar31 + 4);
          sVar45 = *(short *)((long)*palVar31 + 6);
          sVar46 = (short)(*palVar31)[1];
          sVar47 = *(short *)((long)*palVar31 + 10);
          sVar48 = *(short *)((long)*palVar31 + 0xc);
          sVar49 = *(short *)((long)*palVar31 + 0xe);
          auVar61._0_8_ = alVar35[0] << 0x10;
          auVar61._8_8_ = alVar35[1] << 0x10 | alVar35[0] >> 0x30;
          auVar61 = auVar61 | auVar51;
          palVar31 = ptr_00 + (long)iVar24 * size + uVar27;
          sVar60 = auVar61._0_2_ + (short)(*palVar31)[0];
          sVar63 = auVar61._2_2_ + *(short *)((long)*palVar31 + 2);
          sVar65 = auVar61._4_2_ + *(short *)((long)*palVar31 + 4);
          sVar67 = auVar61._6_2_ + *(short *)((long)*palVar31 + 6);
          sVar69 = auVar61._8_2_ + (short)(*palVar31)[1];
          sVar71 = auVar61._10_2_ + *(short *)((long)*palVar31 + 10);
          sVar73 = auVar61._12_2_ + *(short *)((long)*palVar31 + 0xc);
          sVar75 = auVar61._14_2_ + *(short *)((long)*palVar31 + 0xe);
          sVar64 = (ushort)(-1 < sVar42) * sVar42;
          sVar79 = (ushort)(-1 < sVar43) * sVar43;
          sVar70 = (ushort)(-1 < sVar44) * sVar44;
          sVar72 = (ushort)(-1 < sVar45) * sVar45;
          sVar74 = (ushort)(-1 < sVar46) * sVar46;
          sVar68 = (ushort)(-1 < sVar47) * sVar47;
          sVar76 = (ushort)(-1 < sVar48) * sVar48;
          sVar66 = (ushort)(-1 < sVar49) * sVar49;
          uVar50 = (ushort)(sVar64 < sVar60) * sVar60 | (ushort)(sVar64 >= sVar60) * sVar64;
          uVar52 = (ushort)(sVar79 < sVar63) * sVar63 | (ushort)(sVar79 >= sVar63) * sVar79;
          uVar53 = (ushort)(sVar70 < sVar65) * sVar65 | (ushort)(sVar70 >= sVar65) * sVar70;
          uVar54 = (ushort)(sVar72 < sVar67) * sVar67 | (ushort)(sVar72 >= sVar67) * sVar72;
          uVar55 = (ushort)(sVar74 < sVar69) * sVar69 | (ushort)(sVar74 >= sVar69) * sVar74;
          uVar56 = (ushort)(sVar68 < sVar71) * sVar71 | (ushort)(sVar68 >= sVar71) * sVar68;
          uVar57 = (ushort)(sVar76 < sVar73) * sVar73 | (ushort)(sVar76 >= sVar73) * sVar76;
          uVar58 = (ushort)(sVar66 < sVar75) * sVar75 | (ushort)(sVar66 >= sVar75) * sVar66;
          auVar51._0_2_ = uVar59 - sVar40;
          auVar51._2_2_ = uVar50 - sVar41;
          auVar51._4_2_ = uVar52 - sVar40;
          auVar51._6_2_ = uVar53 - sVar41;
          auVar51._8_2_ = uVar54 - sVar40;
          auVar51._10_2_ = uVar55 - sVar41;
          auVar51._12_2_ = uVar56 - sVar40;
          auVar51._14_2_ = uVar57 - sVar41;
          auVar77._0_2_ = -(ushort)(0 < auVar51._0_2_);
          auVar77._2_2_ = -(ushort)(0 < auVar51._2_2_);
          auVar77._4_2_ = -(ushort)(0 < auVar51._4_2_);
          auVar77._6_2_ = -(ushort)(0 < auVar51._6_2_);
          auVar77._8_2_ = -(ushort)(0 < auVar51._8_2_);
          auVar77._10_2_ = -(ushort)(0 < auVar51._10_2_);
          auVar77._12_2_ = -(ushort)(0 < auVar51._12_2_);
          auVar77._14_2_ = -(ushort)(0 < auVar51._14_2_);
          bVar16 = (auVar77 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar17 = (auVar77 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar15 = (auVar77 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar14 = (auVar77 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar13 = (auVar77 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar12 = (auVar77 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar11 = (auVar77 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar10 = (auVar77 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar9 = (auVar77 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar8 = (auVar77 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar7 = (auVar77 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar6 = (auVar77 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar5 = (auVar77 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar4 = (auVar77 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar3 = (auVar77._14_2_ >> 7 & 1) != 0;
          bVar2 = (auVar77._14_2_ & 0x8000) != 0;
          uVar59 = uVar58;
          if (((((((((((((((bVar16 || bVar17) || bVar15) || bVar14) || bVar13) || bVar12) || bVar11)
                     || bVar10) || bVar9) || bVar8) || bVar7) || bVar6) || bVar5) || bVar4) || bVar3
              ) || bVar2) {
            auVar36 = auVar51;
            auVar78 = auVar51;
            if (((((((((((((((bVar16 || bVar17) || bVar15) || bVar14) || bVar13) || bVar12) ||
                        bVar11) || bVar10) || bVar9) || bVar8) || bVar7) || bVar6) || bVar5) ||
                 bVar4) || bVar3) || bVar2) {
              do {
                sVar79 = -sVar37;
                auVar62._2_2_ = auVar51._0_2_ - sVar39;
                auVar62._0_2_ = sVar79;
                auVar62._4_2_ = auVar51._2_2_ - sVar37;
                auVar62._6_2_ = auVar51._4_2_ - sVar39;
                auVar62._8_2_ = auVar51._6_2_ - sVar37;
                auVar62._10_2_ = auVar51._8_2_ - sVar39;
                auVar62._12_2_ = auVar51._10_2_ - sVar37;
                auVar62._14_2_ = auVar51._12_2_ - sVar39;
                sVar64 = auVar36._0_2_;
                auVar78._0_2_ =
                     (ushort)(sVar64 < sVar79) * sVar79 | (ushort)(sVar64 >= sVar79) * sVar64;
                sVar79 = auVar36._2_2_;
                auVar78._2_2_ =
                     (ushort)(sVar79 < auVar62._2_2_) * auVar62._2_2_ |
                     (ushort)(sVar79 >= auVar62._2_2_) * sVar79;
                sVar79 = auVar36._4_2_;
                auVar78._4_2_ =
                     (ushort)(sVar79 < auVar62._4_2_) * auVar62._4_2_ |
                     (ushort)(sVar79 >= auVar62._4_2_) * sVar79;
                sVar79 = auVar36._6_2_;
                auVar78._6_2_ =
                     (ushort)(sVar79 < auVar62._6_2_) * auVar62._6_2_ |
                     (ushort)(sVar79 >= auVar62._6_2_) * sVar79;
                sVar79 = auVar36._8_2_;
                auVar78._8_2_ =
                     (ushort)(sVar79 < auVar62._8_2_) * auVar62._8_2_ |
                     (ushort)(sVar79 >= auVar62._8_2_) * sVar79;
                sVar79 = auVar36._10_2_;
                auVar78._10_2_ =
                     (ushort)(sVar79 < auVar62._10_2_) * auVar62._10_2_ |
                     (ushort)(sVar79 >= auVar62._10_2_) * sVar79;
                sVar79 = auVar36._12_2_;
                sVar64 = auVar36._14_2_;
                auVar78._12_2_ =
                     (ushort)(sVar79 < auVar62._12_2_) * auVar62._12_2_ |
                     (ushort)(sVar79 >= auVar62._12_2_) * sVar79;
                auVar78._14_2_ =
                     (ushort)(sVar64 < auVar62._14_2_) * auVar62._14_2_ |
                     (ushort)(sVar64 >= auVar62._14_2_) * sVar64;
                auVar80._0_2_ = -(ushort)(sVar37 < 0);
                auVar80._2_2_ = -(ushort)(0 < auVar62._2_2_);
                auVar80._4_2_ = -(ushort)(0 < auVar62._4_2_);
                auVar80._6_2_ = -(ushort)(0 < auVar62._6_2_);
                auVar80._8_2_ = -(ushort)(0 < auVar62._8_2_);
                auVar80._10_2_ = -(ushort)(0 < auVar62._10_2_);
                auVar80._12_2_ = -(ushort)(0 < auVar62._12_2_);
                auVar80._14_2_ = -(ushort)(0 < auVar62._14_2_);
                auVar51 = auVar62;
                auVar36 = auVar78;
              } while ((((((((((((((((auVar80 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                    || (auVar80 >> 0xf & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                   (auVar80 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar80 >> 0x27 & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar80 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar80 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar80 >> 0x3f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar80 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar80 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar80 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar80 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar80 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar80._14_2_ >> 7 & 1) != 0) || (auVar80._14_2_ & 0x8000) != 0);
            }
            sVar79 = auVar78._0_2_;
            uVar50 = (ushort)((short)uVar50 < sVar79) * sVar79 | ((short)uVar50 >= sVar79) * uVar50;
            sVar79 = auVar78._2_2_;
            uVar52 = (ushort)((short)uVar52 < sVar79) * sVar79 | ((short)uVar52 >= sVar79) * uVar52;
            sVar79 = auVar78._4_2_;
            uVar53 = (ushort)((short)uVar53 < sVar79) * sVar79 | ((short)uVar53 >= sVar79) * uVar53;
            sVar79 = auVar78._6_2_;
            uVar54 = (ushort)((short)uVar54 < sVar79) * sVar79 | ((short)uVar54 >= sVar79) * uVar54;
            sVar79 = auVar78._8_2_;
            uVar55 = (ushort)((short)uVar55 < sVar79) * sVar79 | ((short)uVar55 >= sVar79) * uVar55;
            sVar79 = auVar78._10_2_;
            uVar56 = (ushort)((short)uVar56 < sVar79) * sVar79 | ((short)uVar56 >= sVar79) * uVar56;
            sVar79 = auVar78._12_2_;
            uVar57 = (ushort)((short)uVar57 < sVar79) * sVar79 | ((short)uVar57 >= sVar79) * uVar57;
            sVar79 = auVar78._14_2_;
            uVar58 = (ushort)((short)uVar58 < sVar79) * sVar79 | ((short)uVar58 >= sVar79) * uVar58;
            sVar79 = sVar79 + (sVar41 - sVar39);
            uVar59 = (sVar79 < (short)uVar58) * uVar58 | (ushort)(sVar79 >= (short)uVar58) * sVar79;
          }
          palVar31 = local_60 + uVar27;
          *(ushort *)*palVar31 = uVar50;
          *(ushort *)((long)*palVar31 + 2) = uVar52;
          *(ushort *)((long)*palVar31 + 4) = uVar53;
          *(ushort *)((long)*palVar31 + 6) = uVar54;
          *(ushort *)(*palVar31 + 1) = uVar55;
          *(ushort *)((long)*palVar31 + 10) = uVar56;
          *(ushort *)((long)*palVar31 + 0xc) = uVar57;
          *(ushort *)((long)*palVar31 + 0xe) = uVar58;
          piVar1 = ((ppVar19->field_4).rowcols)->score_row;
          piVar1[uVar27 * 8 * uVar20 + uVar25] = (int)(short)uVar50;
          piVar1[(uVar27 * 8 + 1) * uVar20 + uVar25] = (int)(short)uVar52;
          piVar1[(uVar27 * 8 + 2) * uVar20 + uVar25] = (int)(short)uVar53;
          palVar31 = ptr_01 + uVar27;
          piVar1[(uVar27 * 8 + 3) * uVar20 + uVar25] = (int)(short)uVar54;
          auVar51 = (undefined1  [16])alVar35 >> 0x70;
          piVar1[(uVar27 * 8 + 4) * uVar20 + uVar25] = (int)(short)uVar55;
          piVar1[(uVar27 * 8 + 5) * uVar20 + uVar25] = (int)(short)uVar56;
          piVar1[(uVar27 * 8 + 6) * uVar20 + uVar25] = (int)(short)uVar57;
          piVar1[(uVar27 * 8 + 7) * uVar20 + uVar25] = (int)(short)uVar58;
          sVar79 = auVar38._0_2_;
          auVar36._0_2_ =
               (sVar79 < (short)uVar50) * uVar50 | (ushort)(sVar79 >= (short)uVar50) * sVar79;
          sVar79 = auVar38._2_2_;
          auVar36._2_2_ =
               (sVar79 < (short)uVar52) * uVar52 | (ushort)(sVar79 >= (short)uVar52) * sVar79;
          sVar79 = auVar38._4_2_;
          auVar36._4_2_ =
               (sVar79 < (short)uVar53) * uVar53 | (ushort)(sVar79 >= (short)uVar53) * sVar79;
          sVar79 = auVar38._6_2_;
          auVar36._6_2_ =
               (sVar79 < (short)uVar54) * uVar54 | (ushort)(sVar79 >= (short)uVar54) * sVar79;
          sVar79 = auVar38._8_2_;
          auVar36._8_2_ =
               (sVar79 < (short)uVar55) * uVar55 | (ushort)(sVar79 >= (short)uVar55) * sVar79;
          sVar79 = auVar38._10_2_;
          auVar36._10_2_ =
               (sVar79 < (short)uVar56) * uVar56 | (ushort)(sVar79 >= (short)uVar56) * sVar79;
          sVar79 = auVar38._12_2_;
          sVar64 = auVar38._14_2_;
          auVar36._12_2_ =
               (sVar79 < (short)uVar57) * uVar57 | (ushort)(sVar79 >= (short)uVar57) * sVar79;
          auVar36._14_2_ =
               (sVar64 < (short)uVar58) * uVar58 | (ushort)(sVar64 >= (short)uVar58) * sVar64;
          sVar79 = uVar50 - sVar40;
          sVar64 = uVar52 - sVar41;
          sVar66 = uVar53 - sVar40;
          sVar68 = uVar54 - sVar41;
          sVar70 = uVar55 - sVar40;
          sVar72 = uVar56 - sVar41;
          sVar74 = uVar57 - sVar40;
          sVar76 = uVar58 - sVar41;
          sVar42 = sVar42 - sVar37;
          sVar43 = sVar43 - sVar39;
          sVar44 = sVar44 - sVar37;
          sVar45 = sVar45 - sVar39;
          sVar46 = sVar46 - sVar37;
          sVar47 = sVar47 - sVar39;
          sVar48 = sVar48 - sVar37;
          sVar49 = sVar49 - sVar39;
          *(ushort *)*palVar31 =
               (ushort)(sVar42 < sVar79) * sVar79 | (ushort)(sVar42 >= sVar79) * sVar42;
          *(ushort *)((long)*palVar31 + 2) =
               (ushort)(sVar43 < sVar64) * sVar64 | (ushort)(sVar43 >= sVar64) * sVar43;
          *(ushort *)((long)*palVar31 + 4) =
               (ushort)(sVar44 < sVar66) * sVar66 | (ushort)(sVar44 >= sVar66) * sVar44;
          *(ushort *)((long)*palVar31 + 6) =
               (ushort)(sVar45 < sVar68) * sVar68 | (ushort)(sVar45 >= sVar68) * sVar45;
          *(ushort *)(*palVar31 + 1) =
               (ushort)(sVar46 < sVar70) * sVar70 | (ushort)(sVar46 >= sVar70) * sVar46;
          *(ushort *)((long)*palVar31 + 10) =
               (ushort)(sVar47 < sVar72) * sVar72 | (ushort)(sVar47 >= sVar72) * sVar47;
          *(ushort *)((long)*palVar31 + 0xc) =
               (ushort)(sVar48 < sVar74) * sVar74 | (ushort)(sVar48 >= sVar74) * sVar48;
          *(ushort *)((long)*palVar31 + 0xe) =
               (ushort)(sVar49 < sVar76) * sVar76 | (ushort)(sVar49 >= sVar76) * sVar49;
          uVar27 = uVar27 + 1;
          auVar38 = auVar36;
        } while (uVar27 != uVar23);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar20);
  }
  iVar22 = -0x4000;
  iVar24 = 8;
  do {
    uVar20 = auVar36._0_8_;
    lVar28 = auVar36._8_8_;
    iVar18 = (int)auVar36._14_2_;
    if (auVar36._14_2_ < iVar22) {
      iVar18 = iVar22;
    }
    iVar22 = iVar18;
    auVar36._0_8_ = uVar20 << 0x10;
    auVar36._8_8_ = lVar28 << 0x10 | uVar20 >> 0x30;
    iVar24 = iVar24 + -1;
  } while (iVar24 != 0);
  ppVar19->score = iVar22;
  ppVar19->flag = ppVar19->flag | 0x8222004;
  local_68 = ppVar19;
  parasail_free(ptr_01);
  parasail_free(ptr);
  parasail_free(ptr_00);
  return ppVar19;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    const int32_t n = 24; /* number of amino acids in table */
    const int32_t segWidth = 8; /* number of values in vector unit */
    const int32_t segLen = (s1Len + segWidth - 1) / segWidth;
    __m128i* const restrict vProfile = parasail_memalign___m128i(16, n * segLen);
    __m128i* restrict pvH = parasail_memalign___m128i(16, segLen);
    __m128i* const restrict pvE = parasail_memalign___m128i(16, segLen);
    int score = NEG_INF_16;
    __m128i vGapO = _mm_set1_epi16(open);
    __m128i vGapE = _mm_set1_epi16(gap);
    __m128i vZero = _mm_setzero_si128();
    __m128i vNegInf = _mm_set1_epi16(NEG_INF_16);
    __m128i vMaxH = vZero;
#ifdef PARASAIL_TABLE
    parasail_result_t *result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    parasail_result_t *result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
    const int32_t offset = segLen - 1;
    const int32_t position = s1Len % segWidth;
#else
    parasail_result_t *result = parasail_result_new();
#endif
#endif

    /* Generate query profile.
     * Rearrange query sequence & calculate the weight of match/mismatch.
     * Don't alias. */
    {
        int32_t index = 0;
        for (k=0; k<n; ++k) {
            for (i=0; i<segLen; ++i) {
                __m128i_16_t t;
                j = i*segWidth;
                for (segNum=0; segNum<segWidth; ++segNum) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[matrix->size*matrix->mapper[(unsigned char)s1[j]]];
                    j += 1;
                }
                _mm_store_si128(&vProfile[index], t.m);
                ++index;
            }
        }
    }

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                h.v[segNum] = 0;
                e.v[segNum] = -open;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vX = vZero;
        __m128i vF = vNegInf;
        const __m128i* pvP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        for (i=0; i<segLen; ++i) {
            __m128i vP;
            __m128i vH;
            __m128i vE;
            __m128i vT1;

            vH = _mm_load_si128(pvH + i);
            vE = _mm_load_si128(pvE + i);

            vT1 = _mm_srli_si128(vH, 14); /* rshift 3 */
            vH = _mm_slli_si128(vH, 2); /* lshift 1 */
            vH = _mm_or_si128(vH, vX);
            vX = vT1;

            vP = _mm_load_si128(pvP + i);
            vH = _mm_add_epi16(vH, vP);
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vZero);

            vF = _mm_srli_si128(vF, 14);
            vF = _mm_or_si128(vF, _mm_slli_si128(vH, 2));
            vF = _mm_sub_epi16(vF, vGapO);
            if (_mm_movemask_epi8(_mm_cmpgt_epi16(vF, vZero))) {
                __m128i vT2 = vF;
                while (_mm_movemask_epi8(_mm_cmpgt_epi16(vT2, vZero))) {
                    vT2 = _mm_slli_si128(vT2, 2);
                    vT2 = _mm_sub_epi16(vT2, vGapE);
                    vF = _mm_max_epi16(vF, vT2);
                }
                vH = _mm_max_epi16(vH, vF);
                vF = _mm_add_epi16(vF, vGapO);
                vF = _mm_sub_epi16(vF, vGapE);
                vF = _mm_max_epi16(vH, vF);
            }
            else {
                vF = vH;
            }

            _mm_store_si128(pvH + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segWidth, j, s2Len);
#endif
            vMaxH = _mm_max_epi16(vMaxH, vH);

            vH = _mm_sub_epi16(vH, vGapO);
            vE = _mm_sub_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segWidth);
    }
#endif

    /* max in vec */
    for (j=0; j<segWidth; ++j) {
        int16_t value = (int16_t) _mm_extract_epi16(vMaxH, 7);
        if (value > score) {
            score = value;
        }
        vMaxH = _mm_slli_si128(vMaxH, 2);
    }

    result->score = score;
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_BLOCKED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    parasail_free(pvE);
    parasail_free(pvH);
    parasail_free(vProfile);

    return result;
}